

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Literals * wasm::getLiteralsFromConstExpression(Literals *__return_storage_ptr__,Expression *curr)

{
  uintptr_t uVar1;
  ulong uVar2;
  initializer_list<wasm::Literal> init;
  Literal local_48;
  
  if (curr->_id == TupleMakeId) {
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 =
         0;
    (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar1 = curr[1].type.id;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (curr[1].type.id <= uVar2) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        getLiteralFromConstExpression(&local_48,*(Expression **)(*(long *)(curr + 1) + uVar2 * 8));
        SmallVector<wasm::Literal,_1UL>::push_back
                  (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_48);
        Literal::~Literal(&local_48);
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  else {
    getLiteralFromConstExpression(&local_48,curr);
    init._M_len = 1;
    init._M_array = &local_48;
    Literals::Literals(__return_storage_ptr__,init);
    Literal::~Literal(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals getLiteralsFromConstExpression(Expression* curr) {
  // TODO: Do we need this function given that Properties::getLiterals
  // (currently) does the same?
  if (auto* t = curr->dynCast<TupleMake>()) {
    Literals values;
    for (auto* operand : t->operands) {
      values.push_back(getLiteralFromConstExpression(operand));
    }
    return values;
  } else {
    return {getLiteralFromConstExpression(curr)};
  }
}